

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcg-op.c
# Opt level: O3

void tcg_gen_add2_i64_tricore
               (TCGContext_conflict9 *tcg_ctx,TCGv_i64 rl,TCGv_i64 rh,TCGv_i64 al,TCGv_i64 ah,
               TCGv_i64 bl,TCGv_i64 bh)

{
  TCGOp *pTVar1;
  uintptr_t o_1;
  uintptr_t o;
  uintptr_t o_3;
  uintptr_t o_2;
  
  pTVar1 = tcg_emit_op_tricore(tcg_ctx,INDEX_op_add2_i64);
  pTVar1->args[0] = (TCGArg)(rl + (long)tcg_ctx);
  pTVar1->args[1] = (TCGArg)(rh + (long)tcg_ctx);
  pTVar1->args[2] = (TCGArg)(al + (long)tcg_ctx);
  pTVar1->args[3] = (TCGArg)(ah + (long)tcg_ctx);
  pTVar1->args[4] = (TCGArg)(bl + (long)tcg_ctx);
  pTVar1->args[5] = (TCGArg)(bh + (long)tcg_ctx);
  return;
}

Assistant:

void tcg_gen_add2_i64(TCGContext *tcg_ctx, TCGv_i64 rl, TCGv_i64 rh, TCGv_i64 al,
                      TCGv_i64 ah, TCGv_i64 bl, TCGv_i64 bh)
{
#if TCG_TARGET_HAS_add2_i64
        tcg_gen_op6_i64(tcg_ctx, INDEX_op_add2_i64, rl, rh, al, ah, bl, bh);
#else
        TCGv_i64 t0 = tcg_temp_new_i64(tcg_ctx);
        TCGv_i64 t1 = tcg_temp_new_i64(tcg_ctx);
        tcg_gen_add_i64(tcg_ctx, t0, al, bl);
        tcg_gen_setcond_i64(tcg_ctx, TCG_COND_LTU, t1, t0, al);
        tcg_gen_add_i64(tcg_ctx, rh, ah, bh);
        tcg_gen_add_i64(tcg_ctx, rh, rh, t1);
        tcg_gen_mov_i64(tcg_ctx, rl, t0);
        tcg_temp_free_i64(tcg_ctx, t0);
        tcg_temp_free_i64(tcg_ctx, t1);
#endif
}